

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O3

bool Reflection::get<short>(Struct *target,string *name,short *value,size_t offset)

{
  char *pcVar1;
  char *__s2;
  bool bVar2;
  short sVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  undefined4 extraout_var_00;
  long lVar6;
  long lVar7;
  type_info *type;
  undefined4 extraout_var_01;
  
  iVar4 = (*target->_vptr_Struct[1])();
  __s2 = _fopen;
  type = (type_info *)CONCAT44(extraout_var,iVar4);
  if (type != (type_info *)0x0) {
    pcVar1 = *(char **)(type + 8);
    if ((pcVar1 == _fopen) || ((*pcVar1 != '*' && (iVar4 = strcmp(pcVar1,_fopen), iVar4 == 0)))) {
      iVar4 = (*target->_vptr_Struct[5])(target,name);
      sVar3 = *(short *)(CONCAT44(extraout_var_00,iVar4) + offset * 2);
LAB_00429afa:
      *value = sVar3;
      return true;
    }
    bVar2 = TypeInfo::is_integral(type);
    if (bVar2) {
      TypeInfo::is_signed(type);
      sVar5 = TypeInfo::size(type);
      if (sVar5 < 2) {
        iVar4 = (*target->_vptr_Struct[5])(target,name);
        lVar6 = CONCAT44(extraout_var_01,iVar4);
        lVar7 = sVar5 * offset;
        pcVar1 = *(char **)(type + 8);
        if ((pcVar1 == ___ostream_insert<wchar_t,std::char_traits<wchar_t>>) ||
           ((*pcVar1 != '*' &&
            (iVar4 = strcmp(pcVar1,___ostream_insert<wchar_t,std::char_traits<wchar_t>>), iVar4 == 0
            )))) {
          *value = (ushort)*(byte *)(lVar6 + lVar7);
        }
        if ((pcVar1 == ___libc_single_threaded) ||
           ((*pcVar1 != '*' && (iVar4 = strcmp(pcVar1,___libc_single_threaded), iVar4 == 0)))) {
          *value = (short)*(char *)(lVar6 + lVar7);
        }
        if ((pcVar1 == __Rb_tree_decrement) ||
           ((*pcVar1 != '*' && (iVar4 = strcmp(pcVar1,__Rb_tree_decrement), iVar4 == 0)))) {
          *value = *(short *)(lVar6 + lVar7);
        }
        if ((pcVar1 == __s2) || ((*pcVar1 != '*' && (iVar4 = strcmp(pcVar1,__s2), iVar4 == 0)))) {
          *value = *(short *)(lVar6 + lVar7);
        }
        if ((pcVar1 == ___throw_bad_array_new_length) ||
           ((*pcVar1 != '*' && (iVar4 = strcmp(pcVar1,___throw_bad_array_new_length), iVar4 == 0))))
        {
          *value = *(short *)(lVar6 + lVar7);
        }
        if ((pcVar1 == _SDL_DestroyWindow) ||
           ((*pcVar1 != '*' && (iVar4 = strcmp(pcVar1,_SDL_DestroyWindow), iVar4 == 0)))) {
          *value = *(short *)(lVar6 + lVar7);
        }
        if ((pcVar1 == _typeinfo) ||
           ((*pcVar1 != '*' && (iVar4 = strcmp(pcVar1,_typeinfo), iVar4 == 0)))) {
          *value = *(short *)(lVar6 + lVar7);
        }
        if (pcVar1 != ___ostream_insert<char,std::char_traits<char>>) {
          if (*pcVar1 == '*') {
            return true;
          }
          iVar4 = strcmp(pcVar1,___ostream_insert<char,std::char_traits<char>>);
          if (iVar4 != 0) {
            return true;
          }
        }
        sVar3 = *(short *)(lVar6 + lVar7);
        goto LAB_00429afa;
      }
    }
  }
  return false;
}

Assistant:

bool get(const Struct &target, const std::string &name, Type &value, size_t offset) {
	const auto target_type = target.type_of(name);
	if(!target_type) return false;

	// If type is a direct match, copy.
	if(*target_type == typeid(Type)) {
		const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * sizeof(Type);
		value = *reinterpret_cast<const Type *>(address);
		return true;
	}

	// If the type is a registered enum and the value type is int, copy.
	if constexpr (std::is_integral<Type>::value && sizeof(Type) == sizeof(int)) {
		if(!Enum::name(*target_type).empty()) {
			memcpy(&value, target.get(name), sizeof(int));
			return true;
		}
	}

	// If the type is an int that is larger than the stored type and matches the signedness, cast upward.
	if constexpr (std::is_integral<Type>::value) {
		if(TypeInfo::is_integral(target_type)) {
			const bool target_is_signed = TypeInfo::is_signed(target_type);
			const size_t target_size = TypeInfo::size(target_type);

			// An unsigned type can map to any larger type, signed or unsigned;
			// a signed type can map to a larger type only if it also is signed.
			if(sizeof(Type) > target_size && (!target_is_signed || std::is_signed<Type>::value)) {
				const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * target_size;

#define Map(x)	if(*target_type == typeid(x)) { value = static_cast<Type>(*reinterpret_cast<const x *>(address)); }
				ForAllInts(Map);
#undef Map
				return true;
			}
		}
	}

	// If the type is a double and stored type is a float, cast upward.
	if constexpr (std::is_floating_point<Type>::value) {
		constexpr size_t size = sizeof(Type);
		const bool target_is_floating_point = TypeInfo::is_floating_point(target_type);
		const size_t target_size = TypeInfo::size(target_type);

		if(size > target_size && target_is_floating_point) {
				const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * target_size;

#define Map(x)	if(*target_type == typeid(x)) { value = static_cast<Type>(*reinterpret_cast<const x *>(address)); }
			ForAllFloats(Map);
#undef Map
			return true;
		}
	}

	return false;
}